

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.hpp
# Opt level: O3

XMLElementDecl * __thiscall
xercesc_4_0::SchemaGrammar::getElemDecl
          (SchemaGrammar *this,uint uriId,XMLCh *baseName,XMLCh *param_3,uint scope)

{
  SchemaElementDecl *pSVar1;
  
  pSVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::getByKey
                     (this->fElemDeclPool,baseName,uriId,scope);
  if (pSVar1 == (SchemaElementDecl *)0x0) {
    pSVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::getByKey
                       (this->fGroupElemDeclPool,baseName,uriId,scope);
    if (pSVar1 == (SchemaElementDecl *)0x0) {
      if (this->fElemNonDeclPool !=
          (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0) {
        pSVar1 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                 getByKey(this->fElemNonDeclPool,baseName,uriId,scope);
        return &pSVar1->super_XMLElementDecl;
      }
      pSVar1 = (SchemaElementDecl *)0x0;
    }
  }
  return &pSVar1->super_XMLElementDecl;
}

Assistant:

inline const XMLElementDecl* SchemaGrammar::getElemDecl( const   unsigned int  uriId
                                              , const XMLCh* const    baseName
                                              , const XMLCh* const
                                              , unsigned int          scope )   const
{
    const SchemaElementDecl* decl = fElemDeclPool->getByKey(baseName, uriId, scope);

    if (!decl) {

        decl = fGroupElemDeclPool->getByKey(baseName, uriId, scope);

        if (!decl && fElemNonDeclPool)
            decl = fElemNonDeclPool->getByKey(baseName, uriId, scope);
    }

    return decl;
}